

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Statement * __thiscall soul::StructuralParser::parseLoopStatement(StructuralParser *this)

{
  bool bVar1;
  LoopStatement *pLVar2;
  Expression *pEVar3;
  Block *pBVar4;
  Context local_30;
  
  local_30.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_30.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_30.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_30.parentScope = this->currentScope;
  pLVar2 = PoolAllocator::allocate<soul::AST::LoopStatement,soul::AST::Context>
                     (&this->allocator->pool,&local_30);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.location.sourceCode.object);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x286aae);
    (pLVar2->numIterations).object = pEVar3;
  }
  pBVar4 = parseStatementAsNewBlock(this);
  (pLVar2->body).object = &pBVar4->super_Statement;
  return &pLVar2->super_Statement;
}

Assistant:

AST::Statement& parseLoopStatement()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        if (matchIf (Operator::openParen))
            loopStatement.numIterations = matchCloseParen (parseExpression());

        loopStatement.body = parseStatementAsNewBlock();
        return loopStatement;
    }